

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseVpfxsParameter(MipsParser *this,Parser *parser,int *result)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Token *pTVar4;
  Identifier *pIVar5;
  void *pvVar6;
  TokenType TVar7;
  int i;
  long lVar8;
  TokenType TVar9;
  byte bVar10;
  TokenSequence tokens;
  TokenSequence tokens_00;
  TokenSequence tokens_01;
  TokenSequence tokens_02;
  TokenSequence tokens_03;
  TokenSequence tokens_04;
  TokenSequence tokens_05;
  TokenSequence tokens_06;
  TokenValueSequence values;
  TokenValueSequence values_00;
  TokenValueSequence values_01;
  TokenValueSequence values_02;
  TokenValueSequence values_03;
  TokenValueSequence values_04;
  TokenValueSequence values_05;
  TokenValueSequence values_06;
  TokenType local_5c [3];
  int constNum;
  anon_union_8_3_8ee6f037_for_TokenSequenceValue_1 local_48;
  int local_40;
  undefined8 local_38;
  
  if ((parseVpfxsParameter(Parser&,int&)::sequenceParser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&parseVpfxsParameter(Parser&,int&)::sequenceParser), iVar3 != 0))
  {
    parseVpfxsParameter::sequenceParser.entries.
    super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parseVpfxsParameter::sequenceParser.entries.
    super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parseVpfxsParameter::sequenceParser.entries.
    super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(TokenSequenceParser::~TokenSequenceParser,&parseVpfxsParameter::sequenceParser,
                 &__dso_handle);
    __cxa_guard_release(&parseVpfxsParameter(Parser&,int&)::sequenceParser);
  }
  if (parseVpfxsParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      parseVpfxsParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    iVar3 = 2;
    local_5c[0] = Integer;
    local_48.textValue = (char *)0x0;
    tokens._M_len = 1;
    tokens._M_array = local_5c;
    values._M_len = 1;
    values._M_array = (iterator)&constNum;
    constNum = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,0,tokens,values);
    local_5c[0] = Integer;
    local_48.intValue = 1;
    tokens_00._M_len = 1;
    tokens_00._M_array = local_5c;
    values_00._M_len = 1;
    values_00._M_array = (iterator)&constNum;
    constNum = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,1,tokens_00,values_00);
    local_5c[0] = 2;
    local_48.intValue = 2;
    tokens_01._M_len = 1;
    tokens_01._M_array = local_5c;
    values_01._M_len = 1;
    values_01._M_array = (iterator)&constNum;
    constNum = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,2,tokens_01,values_01);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_48.intValue = 1;
    local_38 = 2;
    tokens_02._M_len = 3;
    tokens_02._M_array = local_5c;
    values_02._M_len = 2;
    values_02._M_array = (iterator)&constNum;
    local_5c[2] = iVar3;
    constNum = iVar3;
    local_40 = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,3,tokens_02,values_02);
    local_5c[0] = 2;
    local_48.intValue = 3;
    tokens_03._M_len = 1;
    tokens_03._M_array = local_5c;
    values_03._M_len = 1;
    values_03._M_array = (iterator)&constNum;
    constNum = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,4,tokens_03,values_03);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_48.intValue = 1;
    local_38 = 3;
    tokens_04._M_len = 3;
    tokens_04._M_array = local_5c;
    values_04._M_len = 2;
    values_04._M_array = (iterator)&constNum;
    local_5c[2] = iVar3;
    constNum = iVar3;
    local_40 = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,5,tokens_04,values_04);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_48.intValue = 1;
    local_38 = 4;
    tokens_05._M_len = 3;
    tokens_05._M_array = local_5c;
    values_05._M_len = 2;
    values_05._M_array = (iterator)&constNum;
    local_5c[2] = iVar3;
    constNum = iVar3;
    local_40 = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,6,tokens_05,values_05);
    local_5c[0] = Integer;
    local_5c[1] = Div;
    local_48.intValue = 1;
    local_38 = 6;
    tokens_06._M_len = 3;
    tokens_06._M_array = local_5c;
    values_06._M_len = 2;
    values_06._M_array = (iterator)&constNum;
    local_5c[2] = iVar3;
    constNum = iVar3;
    local_40 = iVar3;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,7,tokens_06,values_06);
  }
  pTVar4 = Parser::nextToken(parser);
  if (pTVar4->type != LBrack) {
    return false;
  }
  bVar10 = 0;
  lVar8 = 0;
  do {
    pTVar4 = Parser::nextToken(parser);
    if (lVar8 != 0) {
      if (lVar8 == 4) {
        return pTVar4->type == RBrack;
      }
      if (pTVar4->type != Comma) {
        return false;
      }
      pTVar4 = Parser::nextToken(parser);
    }
    TVar9 = pTVar4->type;
    bVar1 = (byte)lVar8;
    if (TVar9 == Minus) {
      *result = *result | 0x10000 << (bVar1 & 0x1f);
      pTVar4 = Parser::nextToken(parser);
      TVar9 = pTVar4->type;
    }
    TVar7 = TVar9;
    if (TVar9 == BitOr) {
      *result = *result | 0x100 << (bVar1 & 0x1f);
      pTVar4 = Parser::nextToken(parser);
      TVar7 = pTVar4->type;
    }
    if (TVar7 != Identifier) {
      return false;
    }
    pIVar5 = Token::identifierValue(pTVar4);
    if (((pIVar5->_name)._M_string_length == 1) &&
       (pvVar6 = memchr("xyzw",(int)*(pIVar5->_name)._M_dataplus._M_p,5), pvVar6 != (void *)0x0)) {
      *result = *result | (int)pvVar6 + -0x17db4d << (bVar10 & 0x3f);
      if ((TVar9 == BitOr) && (pTVar4 = Parser::nextToken(parser), pTVar4->type != BitOr)) {
        return false;
      }
    }
    else {
      if (TVar9 == BitOr) {
        return false;
      }
      *result = *result | 0x1000 << (bVar1 & 0x1f);
      constNum = -1;
      bVar2 = TokenSequenceParser::parse(&parseVpfxsParameter::sequenceParser,parser,&constNum);
      if (!bVar2) {
        return false;
      }
      *result = 0x100 << (bVar1 & 0x1f) & (constNum << 0x1d) >> 0x1f |
                (constNum & 3U) << (bVar10 & 0x1f) | *result;
    }
    lVar8 = lVar8 + 1;
    bVar10 = bVar10 + 2;
  } while( true );
}

Assistant:

bool MipsParser::parseVpfxsParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// 0
		sequenceParser.addEntry(0, {TokenType::Integer}, {INT64_C(0)} );
		// 1
		sequenceParser.addEntry(1, {TokenType::Integer}, {INT64_C(1)} );
		// 2
		sequenceParser.addEntry(2, {TokenType::Integer}, {INT64_C(2)} );
		// 1/2
		sequenceParser.addEntry(3, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(2)} );
		// 3
		sequenceParser.addEntry(4, {TokenType::Integer}, {INT64_C(3)} );
		// 1/3
		sequenceParser.addEntry(5, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(3)} );
		// 1/4
		sequenceParser.addEntry(6, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(4)} );
		// 1/6
		sequenceParser.addEntry(7, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(6)} );
	}

	if (parser.nextToken().type != TokenType::LBrack)
		return false;
	
	for (int i = 0; i < 4; i++)
	{
		const Token *tokenFinder = &parser.nextToken();

		if (i != 0)
		{
			if (tokenFinder->type != TokenType::Comma)
				return false;

			tokenFinder = &parser.nextToken();
		}
		
		// negation
		if (tokenFinder->type == TokenType::Minus)
		{
			result |= 1 << (16+i);
			tokenFinder = &parser.nextToken();
		}

		// abs
		bool abs = false;
		if (tokenFinder->type == TokenType::BitOr)
		{
			result |= 1 << (8+i);
			abs = true;
			tokenFinder = &parser.nextToken();
		}

		const Token& token = *tokenFinder;
		if (token.type != TokenType::Identifier)
			return false;

		// check for register
		const char* reg;
		static const char* vpfxstRegisters = "xyzw";
		const std::string &stringValue = token.identifierValue().string();
		if (stringValue.size() == 1 && (reg = strchr(vpfxstRegisters,stringValue[0])) != nullptr)
		{
			result |= (reg-vpfxstRegisters) << (i*2);

			if (abs && parser.nextToken().type != TokenType::BitOr)
				return false;

			continue;
		}
		
		// abs is invalid with constants
		if (abs)
			return false;

		result |= 1 << (12+i);

		int constNum = -1;
		if (!sequenceParser.parse(parser,constNum))
			return false;
		
		result |= (constNum & 3) << (i*2);
		if (constNum & 4)
			result |= 1 << (8+i);
	}

	return parser.nextToken().type == TokenType::RBrack;
}